

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.c
# Opt level: O0

void Faces_create(Faces *faces,Dimensions dims_b,int noctant_per_block,Bool_t is_face_comm_async,
                 Env *env)

{
  Bool_t BVar1;
  int iVar2;
  Pointer *pPVar3;
  size_t sVar4;
  int iVar5;
  int local_24;
  int i;
  Env *env_local;
  Bool_t is_face_comm_async_local;
  int noctant_per_block_local;
  Faces *faces_local;
  
  faces->noctant_per_block = noctant_per_block;
  faces->is_face_comm_async = is_face_comm_async;
  pPVar3 = Faces_facexy(faces,0);
  sVar4 = Dimensions_size_facexy(dims_b,4,noctant_per_block);
  BVar1 = Env_cuda_is_using_device(env);
  Pointer_create(pPVar3,sVar4,BVar1);
  pPVar3 = Faces_facexy(faces,0);
  Pointer_set_pinned(pPVar3,1);
  pPVar3 = Faces_facexy(faces,0);
  Pointer_allocate(pPVar3);
  local_24 = 0;
  while( true ) {
    iVar2 = Faces_is_face_comm_async(faces);
    iVar5 = 1;
    if (iVar2 != 0) {
      iVar5 = 3;
    }
    if (iVar5 <= local_24) break;
    pPVar3 = Faces_facexz(faces,local_24);
    sVar4 = Dimensions_size_facexz(dims_b,4,noctant_per_block);
    BVar1 = Env_cuda_is_using_device(env);
    Pointer_create(pPVar3,sVar4,BVar1);
    pPVar3 = Faces_facexz(faces,local_24);
    Pointer_set_pinned(pPVar3,1);
    pPVar3 = Faces_faceyz(faces,local_24);
    sVar4 = Dimensions_size_faceyz(dims_b,4,noctant_per_block);
    BVar1 = Env_cuda_is_using_device(env);
    Pointer_create(pPVar3,sVar4,BVar1);
    pPVar3 = Faces_faceyz(faces,local_24);
    Pointer_set_pinned(pPVar3,1);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar2 = Faces_is_face_comm_async(faces);
    iVar5 = 1;
    if (iVar2 != 0) {
      iVar5 = 3;
    }
    if (iVar5 <= local_24) break;
    pPVar3 = Faces_facexz(faces,local_24);
    Pointer_allocate(pPVar3);
    pPVar3 = Faces_faceyz(faces,local_24);
    Pointer_allocate(pPVar3);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Faces_create( Faces*      faces,
                   Dimensions  dims_b,
                   int         noctant_per_block,
                   Bool_t      is_face_comm_async,
                   Env*        env )
{
  int i = 0;

  faces->noctant_per_block  = noctant_per_block;
  faces->is_face_comm_async = is_face_comm_async;

  /*====================*/
  /*---Allocate faces---*/
  /*====================*/

  Pointer_create(       Faces_facexy( faces, 0 ),
    Dimensions_size_facexy( dims_b, NU, noctant_per_block ),
    Env_cuda_is_using_device( env ) );
  Pointer_set_pinned( Faces_facexy( faces, 0 ), Bool_true );
  Pointer_allocate(     Faces_facexy( faces, 0 ) );

  for( i = 0; i < ( Faces_is_face_comm_async( faces ) ? NDIM : 1 ); ++i )
  {
    Pointer_create(       Faces_facexz( faces, i ),
      Dimensions_size_facexz( dims_b, NU, noctant_per_block ),
      Env_cuda_is_using_device( env ) );
    Pointer_set_pinned( Faces_facexz( faces, i ), Bool_true );

    Pointer_create(       Faces_faceyz( faces, i ),
      Dimensions_size_faceyz( dims_b, NU, noctant_per_block ),
      Env_cuda_is_using_device( env ) );
    Pointer_set_pinned( Faces_faceyz( faces, i ), Bool_true );
  }

  for( i = 0; i < ( Faces_is_face_comm_async( faces ) ? NDIM : 1 ); ++i )
  {
    Pointer_allocate( Faces_facexz( faces, i ) );
    Pointer_allocate( Faces_faceyz( faces, i ) );
  }
}